

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

Matrix<double,__1,__1> __thiscall
Matrix<double,_-1,_-1>::inverse(Matrix<double,__1,__1> *this,int *flag)

{
  double dVar1;
  Matrix<double,__1,__1> MVar2;
  double *pdVar3;
  ostream *poVar4;
  int j;
  int iVar5;
  int iVar6;
  int k;
  int iVar7;
  int iVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  Matrix<double,__1,__1> copy;
  Matrix<double,__1,__1> Identity_;
  
  Identity_.data = (double *)0x0;
  Identity_.rows = -1;
  Identity_.cols = -1;
  copy.data = (double *)0x0;
  copy.rows = -1;
  copy.cols = -1;
  operator=(&copy,*this);
  resize(&Identity_,copy.rows,copy.cols);
  Identity(&Identity_);
  if (this->cols == this->rows) {
    iVar8 = 0;
    while (iVar9 = iVar8, iVar8 = copy.rows + -1, iVar9 < iVar8) {
      pdVar3 = operator()(&copy,iVar9,iVar9);
      iVar8 = iVar9 + 1;
      dVar11 = ABS(*pdVar3);
      iVar7 = iVar9;
      for (iVar5 = iVar8; iVar5 < copy.rows; iVar5 = iVar5 + 1) {
        pdVar3 = operator()(&copy,iVar5,iVar9);
        dVar10 = ABS(*pdVar3);
        iVar6 = iVar5;
        if (dVar10 <= dVar11) {
          dVar10 = dVar11;
          iVar6 = iVar7;
        }
        dVar11 = dVar10;
        iVar7 = iVar6;
      }
      if (ABS(dVar11) <= 1e-10) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"this matrix is not invertible");
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        goto LAB_0010d616;
      }
      iVar5 = iVar8;
      if (iVar7 != iVar9) {
        for (iVar6 = 0; iVar6 < copy.cols; iVar6 = iVar6 + 1) {
          pdVar3 = operator()(&copy,iVar9,iVar6);
          dVar11 = *pdVar3;
          pdVar3 = operator()(&copy,iVar7,iVar6);
          SetElement(&copy,iVar9,iVar6,*pdVar3);
          SetElement(&copy,iVar7,iVar6,dVar11);
          pdVar3 = operator()(&Identity_,iVar9,iVar6);
          dVar11 = *pdVar3;
          pdVar3 = operator()(&Identity_,iVar7,iVar6);
          SetElement(&Identity_,iVar9,iVar6,*pdVar3);
          SetElement(&Identity_,iVar7,iVar6,dVar11);
        }
      }
      for (; iVar5 < copy.rows; iVar5 = iVar5 + 1) {
        pdVar3 = operator()(&copy,iVar5,iVar9);
        dVar11 = *pdVar3;
        pdVar3 = operator()(&copy,iVar9,iVar9);
        dVar10 = *pdVar3;
        for (iVar7 = 0; iVar7 < copy.cols; iVar7 = iVar7 + 1) {
          pdVar3 = operator()(&copy,iVar5,iVar7);
          dVar1 = *pdVar3;
          pdVar3 = operator()(&copy,iVar9,iVar7);
          SetElement(&copy,iVar5,iVar7,dVar1 - *pdVar3 * (dVar11 / dVar10));
          pdVar3 = operator()(&Identity_,iVar5,iVar7);
          dVar1 = *pdVar3;
          pdVar3 = operator()(&Identity_,iVar9,iVar7);
          SetElement(&Identity_,iVar5,iVar7,dVar1 - *pdVar3 * (dVar11 / dVar10));
        }
      }
    }
    iVar9 = copy.rows;
    while (0 < iVar9) {
      iVar9 = iVar9 + -1;
      pdVar3 = operator()(&copy,iVar9,iVar9);
      dVar11 = *pdVar3;
      if (ABS(dVar11) <= 1e-15) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"this matrix is not invertible");
        goto LAB_0010d616;
      }
      for (iVar5 = 0; iVar5 < copy.cols; iVar5 = iVar5 + 1) {
        pdVar3 = operator()(&copy,iVar9,iVar5);
        SetElement(&copy,iVar9,iVar5,*pdVar3 / dVar11);
        pdVar3 = operator()(&Identity_,iVar9,iVar5);
        SetElement(&Identity_,iVar9,iVar5,*pdVar3 / dVar11);
      }
      for (iVar5 = 0; iVar5 != iVar8; iVar5 = iVar5 + 1) {
        pdVar3 = operator()(&copy,iVar5,iVar9);
        dVar11 = *pdVar3;
        for (iVar7 = 0; iVar7 < copy.cols; iVar7 = iVar7 + 1) {
          pdVar3 = operator()(&copy,iVar5,iVar7);
          dVar10 = *pdVar3;
          pdVar3 = operator()(&copy,iVar9,iVar7);
          SetElement(&copy,iVar5,iVar7,dVar10 - *pdVar3 * dVar11);
          pdVar3 = operator()(&Identity_,iVar5,iVar7);
          dVar10 = *pdVar3;
          pdVar3 = operator()(&Identity_,iVar9,iVar7);
          SetElement(&Identity_,iVar5,iVar7,dVar10 - *pdVar3 * dVar11);
        }
      }
      iVar8 = iVar8 + -1;
    }
    iVar8 = 0;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "only square matrix can call this function(inverse)");
LAB_0010d616:
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar8 = 1;
  }
  *flag = iVar8;
  deleteMatrix(&copy);
  MVar2.data = Identity_.data;
  MVar2.rows = Identity_.rows;
  MVar2.cols = Identity_.cols;
  return MVar2;
}

Assistant:

Matrix<Type, _0, _1> Matrix<Type, _0, _1>::inverse(int &flag)
{
    // 此单位阵为待求逆矩阵的增广矩阵
    Matrix<Type, _0, _1> Identity_;
    Matrix<Type, _0, _1> copy;
    copy = (*this);

    if(_0 == Dynamic || _1 == Dynamic)
        Identity_.resize(copy.row(), copy.col());
    Identity_.Identity();

    if(this->col() != this->row())
    {
        cerr << "only square matrix can call this function(inverse)" << endl;
        flag = 1;
        copy.deleteMatrix();
        return Identity_;
    }
    // cout << copy << endl << endl;

    // 将主元置于对角线上
    for (int i = 0; i < copy.row() - 1; ++i)
    {
        // 目前主元位置
        // i行i列
        int posi = i;
        // 初始化主元绝对值大小
        Type value = abs(copy.operator()(i, i));

        // 对第 i+1行开始寻找真正主元
        for(int j = i + 1; j < copy.row(); ++j)
        {
            Type temp = abs(copy.operator()(j, i));
            if(temp > value)
            {
                posi = j;
                value = temp;
            }
        }
        // 若主元为0  则矩阵不可逆
        if (abs(value) <= 1e-10)
        {
            cerr << "this matrix is not invertible" << endl << endl;
            flag = 1;
            copy.deleteMatrix();
            return Identity_;
        }
        // 如果主元不在第i行 则交换两行
        // 同时也要将增广矩阵（单位矩阵）交换相应的两行
        if(posi != i)
        {
            for(int j = 0; j < copy.col(); ++j)
            {
                // 先交换矩阵
                Type temp = copy.operator()(i, j);
                copy.SetElement(i, j, copy.operator()(posi, j));
                copy.SetElement(posi, j, temp);

                // 交换单位阵
                temp = Identity_(i, j);
                Identity_.SetElement(i, j, Identity_(posi, j));
                Identity_.SetElement(posi, j, temp);
            }
        }

        // 将下三角矩阵变为0 (应该可以减少一个循环)
        // 经过实践 并不能少循环
        for(int j = i + 1; j < copy.row(); ++j)
        {
            Type factor = copy.operator()(j, i) / copy.operator()(i, i);
            for(int k = 0; k < copy.col(); ++k)
            {
                Type temp = copy.operator()(j, k) - copy.operator()(i, k) * factor;
                copy.SetElement(j, k, temp);

                temp = Identity_(j, k) - Identity_(i, k) * factor;
                Identity_.SetElement(j, k, temp);
            }
        }
    }

    // 判断对角元素是否为0
    // 若为0则矩阵不可逆
    // 若不为0 则将对角置为1 
    // 且将上三角置为0
    for(int i = copy.row() - 1; i > -1; --i)
    {
        Type temp = copy.operator()(i, i);
        if(abs(temp) <= 1e-15)
        {
            cerr << "this matrix is not invertible" << endl;
            flag = 1;
            copy.deleteMatrix();
            return Identity_;
        }
        // 将对角置1
        for(int j = 0; j < copy.col(); ++j)
        {
            Type deno = copy.operator()(i, j) / temp;
            copy.SetElement(i, j, deno);

            deno = Identity_(i, j) / temp;
            Identity_.SetElement(i, j, deno);
        }
        // 同样的方法上三角置0
        for(int j = 0; j < i; ++j)
        {
            Type deno = copy.operator()(j, i);
            for(int k = 0; k < copy.col(); ++k)
            {
                Type temp = copy.operator()(j, k) - copy.operator()(i, k) * deno;
                copy.SetElement(j, k, temp);
                temp = Identity_(j, k) - Identity_(i, k) * deno;
                Identity_.SetElement(j, k, temp);
            }
        }
    }
    flag = 0;
    copy.deleteMatrix();
    return Identity_;
}